

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue JS_GetIterator2(JSContext *ctx,JSValue obj,JSValue method)

{
  JSValue v;
  
  v = JS_Call(ctx,method,obj,0,(JSValue *)0x0);
  if (((int)v.tag != -1) && ((int)v.tag != 6)) {
    JS_FreeValue(ctx,v);
    JS_ThrowTypeErrorNotAnObject(ctx);
    v = (JSValue)(ZEXT816(6) << 0x40);
  }
  return v;
}

Assistant:

static JSValue JS_GetIterator2(JSContext *ctx, JSValueConst obj,
                               JSValueConst method)
{
    JSValue enum_obj;

    enum_obj = JS_Call(ctx, method, obj, 0, NULL);
    if (JS_IsException(enum_obj))
        return enum_obj;
    if (!JS_IsObject(enum_obj)) {
        JS_FreeValue(ctx, enum_obj);
        return JS_ThrowTypeErrorNotAnObject(ctx);
    }
    return enum_obj;
}